

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

RegSlot __thiscall
ByteCodeGenerator::PrependLocalScopes
          (ByteCodeGenerator *this,RegSlot evalEnv,RegSlot tempLoc,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  uint uVar1;
  Scope *pSVar2;
  Scope *pSVar3;
  RegSlot R0;
  RegSlot RVar4;
  Scope *pSVar5;
  Scope *pSVar6;
  
  pSVar2 = this->currentScope;
  pSVar6 = funcInfo->currentChildScope;
  if (pSVar6 == (Scope *)0x0) {
    pSVar6 = funcInfo->bodyScope;
  }
  if (pSVar2 != pSVar6) {
    R0 = tempLoc;
    if (tempLoc == 0xffffffff) {
      R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    if (pSVar2 != pSVar6) {
      this_00 = &this->m_writer;
      pSVar3 = pSVar2;
      do {
        do {
          pSVar5 = pSVar3;
          pSVar3 = pSVar5->enclosingScope;
        } while (pSVar5->enclosingScope != pSVar6);
        if ((pSVar5->field_0x44 & 0x10) != 0) {
          uVar1 = pSVar5->innerScopeIndex;
          RVar4 = FuncInfo::GetEnvRegister(funcInfo);
          if (uVar1 == 0xffffffff) {
            if ((evalEnv == RVar4) || (evalEnv == funcInfo->frameDisplayRegister)) {
              Js::ByteCodeWriter::Reg2(this_00,LdInnerFrameDisplayNoParent,R0,pSVar5->location);
              evalEnv = R0;
            }
            else {
              Js::ByteCodeWriter::Reg3(this_00,LdInnerFrameDisplay,R0,pSVar5->location,evalEnv);
              evalEnv = R0;
            }
          }
          else if ((evalEnv == RVar4) || (evalEnv == funcInfo->frameDisplayRegister)) {
            Js::ByteCodeWriter::Reg1Unsigned1
                      (this_00,LdIndexedFrameDisplayNoParent,R0,pSVar5->innerScopeIndex);
            evalEnv = R0;
          }
          else {
            Js::ByteCodeWriter::Reg2Int1
                      (this_00,LdIndexedFrameDisplay,R0,evalEnv,pSVar5->innerScopeIndex);
            evalEnv = R0;
          }
        }
        pSVar3 = pSVar2;
        pSVar6 = pSVar5;
      } while (pSVar2 != pSVar5);
    }
    if (tempLoc == 0xffffffff) {
      FuncInfo::ReleaseTmpRegister(funcInfo,R0);
    }
  }
  return evalEnv;
}

Assistant:

Js::RegSlot ByteCodeGenerator::PrependLocalScopes(Js::RegSlot evalEnv, Js::RegSlot tempLoc, FuncInfo *funcInfo)
{
    Scope *currScope = this->currentScope;
    Scope *funcScope = funcInfo->GetCurrentChildScope() ? funcInfo->GetCurrentChildScope() : funcInfo->GetBodyScope();

    if (currScope == funcScope)
    {
        return evalEnv;
    }

    bool acquireTempLoc = tempLoc == Js::Constants::NoRegister;
    if (acquireTempLoc)
    {
        tempLoc = funcInfo->AcquireTmpRegister();
    }

    // The with/catch objects must be prepended to the environment we pass to eval() or to a func declared inside with,
    // but the list must first be reversed so that innermost scopes appear first in the list.
    while (currScope != funcScope)
    {
        Scope *innerScope;
        for (innerScope = currScope; innerScope->GetEnclosingScope() != funcScope; innerScope = innerScope->GetEnclosingScope())
            ;
        if (innerScope->GetMustInstantiate())
        {
            if (!innerScope->HasInnerScopeIndex())
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg2(Js::OpCode::LdInnerFrameDisplayNoParent, tempLoc, innerScope->GetLocation());
                }
                else
                {
                    this->m_writer.Reg3(Js::OpCode::LdInnerFrameDisplay, tempLoc, innerScope->GetLocation(), evalEnv);
                }
            }
            else
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg1Unsigned1(Js::OpCode::LdIndexedFrameDisplayNoParent, tempLoc, innerScope->GetInnerScopeIndex());
                }
                else
                {
                    this->m_writer.Reg2Int1(Js::OpCode::LdIndexedFrameDisplay, tempLoc, evalEnv, innerScope->GetInnerScopeIndex());
                }
            }
            evalEnv = tempLoc;
        }
        funcScope = innerScope;
    }

    if (acquireTempLoc)
    {
        funcInfo->ReleaseTmpRegister(tempLoc);
    }
    return evalEnv;
}